

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

void av1_highbd_filter_intra_edge_c(uint16_t *p,int sz,int strength)

{
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int k;
  int j;
  int s;
  int i;
  uint16_t edge [129];
  int filt;
  int kernel [3] [5];
  int local_180;
  int local_17c;
  int local_174;
  int local_170;
  int local_16c;
  ushort local_168 [134];
  int local_5c;
  int local_58 [18];
  int local_10;
  int local_c;
  void *local_8;
  
  if (in_EDX != 0) {
    local_10 = in_EDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    memcpy(local_58,&DAT_00b8ec40,0x3c);
    local_5c = local_10 + -1;
    memcpy(local_168,local_8,(long)local_c << 1);
    for (local_16c = 1; local_16c < local_c; local_16c = local_16c + 1) {
      local_170 = 0;
      for (local_174 = 0; local_174 < 5; local_174 = local_174 + 1) {
        local_17c = local_16c + -2 + local_174;
        if (local_17c < 0) {
          local_17c = 0;
        }
        if (local_c + -1 < local_17c) {
          local_180 = local_c + -1;
        }
        else {
          local_180 = local_17c;
        }
        local_170 = (uint)local_168[local_180] * local_58[(long)local_5c * 5 + (long)local_174] +
                    local_170;
      }
      *(short *)((long)local_8 + (long)local_16c * 2) = (short)(local_170 + 8 >> 4);
    }
  }
  return;
}

Assistant:

void av1_highbd_filter_intra_edge_c(uint16_t *p, int sz, int strength) {
  if (!strength) return;

  const int kernel[INTRA_EDGE_FILT][INTRA_EDGE_TAPS] = { { 0, 4, 8, 4, 0 },
                                                         { 0, 5, 6, 5, 0 },
                                                         { 2, 4, 4, 4, 2 } };
  const int filt = strength - 1;
  uint16_t edge[129];

  memcpy(edge, p, sz * sizeof(*p));
  for (int i = 1; i < sz; i++) {
    int s = 0;
    for (int j = 0; j < INTRA_EDGE_TAPS; j++) {
      int k = i - 2 + j;
      k = (k < 0) ? 0 : k;
      k = (k > sz - 1) ? sz - 1 : k;
      s += edge[k] * kernel[filt][j];
    }
    s = (s + 8) >> 4;
    p[i] = s;
  }
}